

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O3

void avg_nmv(nmv_context *nmv_left,nmv_context *nmv_tr,int wt_left,int wt_tr)

{
  int iVar1;
  bool bVar2;
  aom_cdf_prob (*paaVar3) [3];
  int j_2;
  long lVar4;
  int iVar5;
  bool bVar6;
  int j;
  long lVar7;
  int j_8;
  aom_cdf_prob (*paaVar8) [5];
  int i;
  aom_cdf_prob (*paaVar9) [3];
  int j_1;
  long lVar10;
  aom_cdf_prob (*paaVar11) [5];
  
  iVar1 = wt_tr + wt_left;
  iVar5 = iVar1 / 2;
  lVar7 = 0;
  do {
    nmv_left->joints_cdf[lVar7] =
         (aom_cdf_prob)
         ((int)((uint)nmv_left->joints_cdf[lVar7] * wt_left + iVar5 +
               (uint)nmv_tr->joints_cdf[lVar7] * wt_tr) / iVar1);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  lVar7 = 0;
  bVar2 = true;
  do {
    bVar6 = bVar2;
    lVar10 = 0;
    do {
      nmv_left->comps[lVar7].classes_cdf[lVar10] =
           (aom_cdf_prob)
           ((int)((uint)nmv_left->comps[lVar7].classes_cdf[lVar10] * wt_left + iVar5 +
                 (uint)nmv_tr->comps[lVar7].classes_cdf[lVar10] * wt_tr) / iVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0xc);
    paaVar11 = nmv_left->comps[lVar7].class0_fp_cdf;
    paaVar8 = nmv_tr->comps[lVar7].class0_fp_cdf;
    lVar10 = 0;
    do {
      lVar4 = 0;
      do {
        (*paaVar11)[lVar4] =
             (aom_cdf_prob)
             ((int)((uint)(*paaVar11)[lVar4] * wt_left + iVar5 + (uint)(*paaVar8)[lVar4] * wt_tr) /
             iVar1);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
      lVar10 = lVar10 + 1;
      paaVar8 = paaVar8 + 1;
      paaVar11 = paaVar11 + 1;
    } while (lVar10 != 2);
    lVar10 = 0;
    do {
      nmv_left->comps[lVar7].fp_cdf[lVar10] =
           (aom_cdf_prob)
           ((int)((uint)nmv_left->comps[lVar7].fp_cdf[lVar10] * wt_left + iVar5 +
                 (uint)nmv_tr->comps[lVar7].fp_cdf[lVar10] * wt_tr) / iVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    lVar10 = 0;
    do {
      nmv_left->comps[lVar7].sign_cdf[lVar10] =
           (aom_cdf_prob)
           ((int)((uint)nmv_left->comps[lVar7].sign_cdf[lVar10] * wt_left + iVar5 +
                 (uint)nmv_tr->comps[lVar7].sign_cdf[lVar10] * wt_tr) / iVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      nmv_left->comps[lVar7].class0_hp_cdf[lVar10] =
           (aom_cdf_prob)
           ((int)((uint)nmv_left->comps[lVar7].class0_hp_cdf[lVar10] * wt_left + iVar5 +
                 (uint)nmv_tr->comps[lVar7].class0_hp_cdf[lVar10] * wt_tr) / iVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      nmv_left->comps[lVar7].hp_cdf[lVar10] =
           (aom_cdf_prob)
           ((int)((uint)nmv_left->comps[lVar7].hp_cdf[lVar10] * wt_left + iVar5 +
                 (uint)nmv_tr->comps[lVar7].hp_cdf[lVar10] * wt_tr) / iVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 0;
    do {
      nmv_left->comps[lVar7].class0_cdf[lVar10] =
           (aom_cdf_prob)
           ((int)((uint)nmv_left->comps[lVar7].class0_cdf[lVar10] * wt_left + iVar5 +
                 (uint)nmv_tr->comps[lVar7].class0_cdf[lVar10] * wt_tr) / iVar1);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    paaVar9 = nmv_left->comps[lVar7].bits_cdf;
    paaVar3 = nmv_tr->comps[lVar7].bits_cdf;
    lVar7 = 0;
    do {
      lVar10 = 0;
      do {
        (*paaVar9)[lVar10] =
             (aom_cdf_prob)
             ((int)((uint)(*paaVar9)[lVar10] * wt_left + iVar5 + (uint)(*paaVar3)[lVar10] * wt_tr) /
             iVar1);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar7 = lVar7 + 1;
      paaVar3 = paaVar3 + 1;
      paaVar9 = paaVar9 + 1;
    } while (lVar7 != 10);
    lVar7 = 1;
    bVar2 = false;
  } while (bVar6);
  return;
}

Assistant:

static void avg_nmv(nmv_context *nmv_left, nmv_context *nmv_tr, int wt_left,
                    int wt_tr) {
  AVERAGE_CDF(nmv_left->joints_cdf, nmv_tr->joints_cdf, 4);
  for (int i = 0; i < 2; i++) {
    AVERAGE_CDF(nmv_left->comps[i].classes_cdf, nmv_tr->comps[i].classes_cdf,
                MV_CLASSES);
    AVERAGE_CDF(nmv_left->comps[i].class0_fp_cdf,
                nmv_tr->comps[i].class0_fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].fp_cdf, nmv_tr->comps[i].fp_cdf, MV_FP_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].sign_cdf, nmv_tr->comps[i].sign_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_hp_cdf,
                nmv_tr->comps[i].class0_hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].hp_cdf, nmv_tr->comps[i].hp_cdf, 2);
    AVERAGE_CDF(nmv_left->comps[i].class0_cdf, nmv_tr->comps[i].class0_cdf,
                CLASS0_SIZE);
    AVERAGE_CDF(nmv_left->comps[i].bits_cdf, nmv_tr->comps[i].bits_cdf, 2);
  }
}